

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slufactor.hpp
# Opt level: O3

void __thiscall
soplex::
SLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::solveRight(SLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *this,SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *x,
            SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *b)

{
  undefined8 *puVar1;
  uint *puVar2;
  int iVar3;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar4;
  pointer pnVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  long lVar13;
  ulong uVar14;
  
  (*this->solveTime->_vptr_Timer[3])();
  lVar13 = (long)b->memused;
  if (0 < lVar13) {
    uVar14 = lVar13 + 1;
    lVar13 = lVar13 * 0x54 + -4;
    do {
      pNVar4 = b->m_elem;
      iVar3 = *(int *)((long)(pNVar4->val).m_backend.data._M_elems + lVar13);
      pnVar5 = (this->vec).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      puVar1 = (undefined8 *)((long)(&pNVar4->val + -1) + lVar13);
      uVar6 = *puVar1;
      uVar7 = puVar1[1];
      puVar1 = (undefined8 *)((long)(&(pNVar4->val).m_backend.data + -1) + lVar13);
      uVar8 = *puVar1;
      uVar9 = puVar1[1];
      puVar1 = (undefined8 *)((long)(pNVar4->val).m_backend.data._M_elems + lVar13 + -0x30);
      uVar10 = *puVar1;
      uVar11 = puVar1[1];
      puVar1 = (undefined8 *)((long)(pNVar4->val).m_backend.data._M_elems + lVar13 + -0x20);
      uVar12 = puVar1[1];
      puVar2 = pnVar5[iVar3].m_backend.data._M_elems + 0xc;
      *(undefined8 *)puVar2 = *puVar1;
      *(undefined8 *)(puVar2 + 2) = uVar12;
      puVar2 = pnVar5[iVar3].m_backend.data._M_elems + 8;
      *(undefined8 *)puVar2 = uVar10;
      *(undefined8 *)(puVar2 + 2) = uVar11;
      puVar2 = pnVar5[iVar3].m_backend.data._M_elems + 4;
      *(undefined8 *)puVar2 = uVar8;
      *(undefined8 *)(puVar2 + 2) = uVar9;
      *(undefined8 *)&pnVar5[iVar3].m_backend.data = uVar6;
      *(undefined8 *)(pnVar5[iVar3].m_backend.data._M_elems + 2) = uVar7;
      pnVar5[iVar3].m_backend.exp =
           *(int *)((long)(pNVar4->val).m_backend.data._M_elems + lVar13 + -0x10);
      pnVar5[iVar3].m_backend.neg =
           *(bool *)((long)(pNVar4->val).m_backend.data._M_elems + lVar13 + -0xc);
      uVar6 = *(undefined8 *)((long)(pNVar4->val).m_backend.data._M_elems + lVar13 + -8);
      pnVar5[iVar3].m_backend.fpclass = (int)uVar6;
      pnVar5[iVar3].m_backend.prec_elem = (int)((ulong)uVar6 >> 0x20);
      uVar14 = uVar14 - 1;
      lVar13 = lVar13 + -0x54;
    } while (1 < uVar14);
  }
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::clear(x);
  x->setupStatus = false;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::solveRight(&this->
                super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ,(x->
                super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start,
               (this->vec).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
  this->solveCount = this->solveCount + 1;
  (*this->solveTime->_vptr_Timer[4])();
  return;
}

Assistant:

void SLUFactor<R>::solveRight(SSVectorBase<R>& x, const SVectorBase<R>& b)  //const
{

   solveTime->start();

   vec.assign(b);
   x.clear();
   CLUFactor<R>::solveRight(x.altValues(), vec.get_ptr());

   solveCount++;
   solveTime->stop();
}